

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_by_name.c
# Opt level: O2

int archive_write_set_format_by_name(archive *a,char *name)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x1e0) {
      archive_set_error(a,0x16,"No such format \'%s\'",name);
      a->state = 0x8000;
      return -0x1e;
    }
    iVar2 = strcmp(name,*(char **)((long)&names[0].name + lVar3));
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  iVar2 = (**(code **)((long)&names[0].setter + lVar3))(a);
  return iVar2;
}

Assistant:

int
archive_write_set_format_by_name(struct archive *a, const char *name)
{
	int i;

	for (i = 0; names[i].name != NULL; i++) {
		if (strcmp(name, names[i].name) == 0)
			return ((names[i].setter)(a));
	}

	archive_set_error(a, EINVAL, "No such format '%s'", name);
	a->state = ARCHIVE_STATE_FATAL;
	return (ARCHIVE_FATAL);
}